

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Mio_WriteLibrary(FILE *pFile,Mio_Library_t *pLib,int fPrintSops,int fShort,int fSelected)

{
  char *pcVar1;
  Mio_Library_t *pMVar2;
  int fAllPins;
  Vec_Ptr_t *pVVar3;
  Mio_Cell2_t *__ptr;
  Mio_Gate_t *pMVar4;
  size_t sVar5;
  size_t sVar6;
  Mio_Pin_t *pPin;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint i;
  long lVar13;
  uint uVar14;
  int iVar15;
  void **ppvVar16;
  int local_64;
  int nCells;
  Mio_Library_t *local_48;
  FILE *local_40;
  Vec_Ptr_t *local_38;
  
  local_40 = (FILE *)pFile;
  pVVar3 = Vec_PtrAlloc(1000);
  local_48 = pLib;
  if (fShort == 0) {
    fAllPins = Mio_CheckGates(pLib);
  }
  else {
    fAllPins = 1;
  }
  pMVar2 = local_48;
  if (fSelected == 0) {
    for (lVar13 = 0; lVar13 < pMVar2->nGates; lVar13 = lVar13 + 1) {
      Vec_PtrPush(pVVar3,pMVar2->ppGates0[lVar13]);
    }
  }
  else {
    __ptr = Mio_CollectRootsNewDefault2(6,&nCells,0);
    ppvVar16 = &__ptr->pMioGate;
    for (lVar13 = 0; lVar13 < nCells; lVar13 = lVar13 + 1) {
      Vec_PtrPush(pVVar3,*ppvVar16);
      ppvVar16 = ppvVar16 + 10;
    }
    free(__ptr);
  }
  uVar11 = pVVar3->nSize;
  i = 0;
  uVar14 = 0;
  if (0 < (int)uVar11) {
    uVar14 = uVar11;
  }
  uVar9 = 0;
  local_64 = 0;
  local_38 = pVVar3;
  iVar15 = 0;
  while( true ) {
    pVVar3 = local_38;
    if (i == uVar14) break;
    pMVar4 = (Mio_Gate_t *)Vec_PtrEntry(local_38,i);
    sVar5 = strlen(pMVar4->pName);
    sVar6 = strlen(pMVar4->pOutName);
    uVar12 = sVar6 & 0xffffffff;
    if ((int)sVar6 < (int)uVar9) {
      uVar12 = uVar9;
    }
    sVar6 = strlen(pMVar4->pForm);
    pPin = Mio_GateReadPins(pMVar4);
    uVar9 = uVar12;
    while (pPin != (Mio_Pin_t *)0x0) {
      sVar7 = strlen(pPin->pName);
      uVar12 = sVar7 & 0xffffffff;
      if ((int)sVar7 < (int)uVar9) {
        uVar12 = uVar9;
      }
      pPin = Mio_PinReadNext(pPin);
      uVar9 = uVar12;
    }
    iVar10 = (int)sVar5;
    if ((int)sVar5 < iVar15) {
      iVar10 = iVar15;
    }
    iVar15 = (int)sVar6;
    if ((int)sVar6 < local_64) {
      iVar15 = local_64;
    }
    i = i + 1;
    local_64 = iVar15;
    iVar15 = iVar10;
  }
  pcVar1 = local_48->pName;
  pcVar8 = Extra_TimeStamp();
  fprintf(local_40,"# The genlib library \"%s\" with %d gates written by ABC on %s\n",pcVar1,
          (ulong)uVar11,pcVar8);
  for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
    pMVar4 = (Mio_Gate_t *)Vec_PtrEntry(pVVar3,uVar11);
    Mio_WriteGate((FILE *)local_40,pMVar4,iVar15,(int)uVar9,local_64,fPrintSops,fAllPins);
  }
  Vec_PtrFree(pVVar3);
  return;
}

Assistant:

void Mio_WriteLibrary( FILE * pFile, Mio_Library_t * pLib, int fPrintSops, int fShort, int fSelected )
{
    Mio_Gate_t * pGate;
    Mio_Pin_t * pPin;
    Vec_Ptr_t * vGates = Vec_PtrAlloc( 1000 );
    int i, nCells, GateLen = 0, NameLen = 0, FormLen = 0;
    int fAllPins = fShort || Mio_CheckGates( pLib );
    if ( fSelected )
    {
        Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
        for ( i = 0; i < nCells; i++ )
            Vec_PtrPush( vGates, pCells[i].pMioGate );
        ABC_FREE( pCells );
    }
    else
    {
        for ( i = 0; i < pLib->nGates; i++ )
            Vec_PtrPush( vGates, pLib->ppGates0[i] );
    }
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
    {
        GateLen = Abc_MaxInt( GateLen, strlen(pGate->pName) );
        NameLen = Abc_MaxInt( NameLen, strlen(pGate->pOutName) );
        FormLen = Abc_MaxInt( FormLen, strlen(pGate->pForm) );
        Mio_GateForEachPin( pGate, pPin )
            NameLen = Abc_MaxInt( NameLen, strlen(pPin->pName) );
    }
    fprintf( pFile, "# The genlib library \"%s\" with %d gates written by ABC on %s\n", pLib->pName, Vec_PtrSize(vGates), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
        Mio_WriteGate( pFile, pGate, GateLen, NameLen, FormLen, fPrintSops, fAllPins );
    Vec_PtrFree( vGates );
}